

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm2.c
# Opt level: O1

int sm2_sig_asn1_decode(uint8_t *r,uint8_t *s,uint8_t *sig,int siglen)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  
  if (s == (uint8_t *)0x0) {
    return 0;
  }
  if (r == (uint8_t *)0x0) {
    return 0;
  }
  if (sig == (uint8_t *)0x0) {
    return 0;
  }
  if (*sig != '0') {
    return 0;
  }
  if (0x46 < sig[1]) {
    return 0;
  }
  if (sig[1] + 2 != siglen) {
    return 0;
  }
  bVar5 = true;
  iVar8 = 0;
  if (sig[2] == '\x02') {
    bVar1 = sig[3];
    uVar7 = (ulong)bVar1;
    if (0xde < (byte)(bVar1 - 0x22)) {
      if (bVar1 == 0x21) {
        uVar2 = *(undefined8 *)(sig + 5);
        uVar3 = *(undefined8 *)(sig + 0xd);
        uVar4 = *(undefined8 *)(sig + 0x1d);
        *(undefined8 *)(r + 0x10) = *(undefined8 *)(sig + 0x15);
        *(undefined8 *)(r + 0x18) = uVar4;
        *(undefined8 *)r = uVar2;
        *(undefined8 *)(r + 8) = uVar3;
      }
      else {
        memset(r,0,0x20 - uVar7);
        memcpy(r + (0x20 - uVar7),sig + 4,(ulong)(uint)bVar1);
      }
      lVar6 = uVar7 + 2;
      bVar5 = false;
      goto LAB_00124c17;
    }
  }
  lVar6 = 0;
LAB_00124c17:
  if ((!bVar5) && (sig[lVar6 + 2] == '\x02')) {
    bVar1 = sig[lVar6 + 3];
    if (0xde < (byte)(bVar1 - 0x22)) {
      if (bVar1 == 0x21) {
        uVar2 = *(undefined8 *)(sig + lVar6 + 5);
        uVar3 = *(undefined8 *)(sig + lVar6 + 0xd);
        uVar4 = *(undefined8 *)(sig + lVar6 + 0x1d);
        *(undefined8 *)(s + 0x10) = *(undefined8 *)(sig + lVar6 + 0x15);
        *(undefined8 *)(s + 0x18) = uVar4;
        *(undefined8 *)s = uVar2;
        *(undefined8 *)(s + 8) = uVar3;
      }
      else {
        uVar7 = (ulong)(0x20 - bVar1);
        memset(s,0,uVar7);
        memcpy(s + uVar7,sig + lVar6 + 4,(ulong)bVar1);
      }
      iVar8 = 1;
    }
  }
  return iVar8;
}

Assistant:

int sm2_sig_asn1_decode(uint8_t r[32], uint8_t s[32], uint8_t sig[128], int siglen)
{
    int ret = GML_ERROR;
    int r_asn1_len, s_asn1_len;
    int total_len;

    if (sig == NULL || r == NULL || s == NULL)
        goto end;

    if (*sig != 0x30U) // sig = 0x30 ?? 02 ?? r 02 ?? s
        goto end;
    sig++;

    total_len = (int)(*sig); // sig = ?? 02 ?? r 02 ?? s
    if (total_len > 0x46 || siglen != (total_len + 2))
        goto end;
    sig++;

    if (sm2_bn_asn1_decode(r, &r_asn1_len, sig) == GML_ERROR)
        goto end;
    sig += r_asn1_len;

    if (sm2_bn_asn1_decode(s, &s_asn1_len, sig) == GML_ERROR)
        goto end;

    ret = GML_OK;
end:
    return ret;
}